

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getGlobal
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name name)

{
  key_type *__k;
  mapped_type *pmVar1;
  long lVar2;
  mapped_type *pmVar3;
  undefined8 *puVar4;
  Name NVar5;
  Name NVar6;
  Name NVar7;
  
  NVar5.super_IString.str._M_str = name.super_IString.str._M_len;
  NVar5.super_IString.str._M_len = (size_t)this->wasm;
  __k = (key_type *)wasm::Module::getGlobal(NVar5);
  if (__k[2].super_IString.str._M_len != 0) {
    do {
      pmVar1 = std::
               map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
               ::at(&this->linkedInstances,(key_type *)&__k[1].super_IString.str._M_str);
      this = &((pmVar1->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_ModuleRunnerBase<wasm::ModuleRunner>;
      NVar6.super_IString.str._M_str = __k[2].super_IString.str._M_str;
      NVar6.super_IString.str._M_len = (size_t)this->wasm;
      lVar2 = wasm::Module::getExport(NVar6);
      puVar4 = (undefined8 *)(lVar2 + 0x18);
      if (*(char *)(lVar2 + 0x28) != '\0') {
        puVar4 = (undefined8 *)0x0;
      }
      NVar7.super_IString.str._M_str = (char *)*puVar4;
      NVar7.super_IString.str._M_len = (size_t)this->wasm;
      __k = (key_type *)wasm::Module::getGlobal(NVar7);
    } while (__k[2].super_IString.str._M_len != 0);
  }
  pmVar3 = std::
           map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
           ::operator[](&this->globals,__k);
  return pmVar3;
}

Assistant:

Literals& getGlobal(Name name) {
    auto* inst = self();
    auto* global = inst->wasm.getGlobal(name);
    while (global->imported()) {
      inst = inst->linkedInstances.at(global->module).get();
      Export* globalExport = inst->wasm.getExport(global->base);
      global = inst->wasm.getGlobal(*globalExport->getInternalName());
    }

    return inst->globals[global->name];
  }